

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O1

ixy_device * ixy_init(char *pci_addr,uint16_t rx_queues,uint16_t tx_queues,int interrupt_timeout)

{
  uint16_t *puVar1;
  uint8_t **ppuVar2;
  uint16_t *puVar3;
  long *plVar4;
  _Bool _Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  __uid_t _Var9;
  int iVar10;
  ssize_t sVar11;
  ixy_device *piVar12;
  ixgbe_device *dev;
  char *pcVar13;
  uint8_t *puVar14;
  void *pvVar15;
  long lVar16;
  ulong uVar17;
  pkt_buf *ppVar18;
  uint64_t uVar19;
  ulong uVar20;
  ixy_device *piVar21;
  uint uVar22;
  ixgbe_device *piVar23;
  ushort extraout_DX;
  uint uVar24;
  int iVar25;
  undefined6 in_register_00000012;
  long extraout_RDX;
  long extraout_RDX_00;
  ulong uVar26;
  ulong uVar27;
  uint16_t queue_id;
  long *plVar28;
  uint uVar29;
  undefined6 in_register_00000032;
  stat *__buf;
  stat *psVar30;
  long lVar31;
  ushort uVar32;
  ixgbe_device *dev_00;
  ushort uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong unaff_R13;
  interrupt_queues *interrupt;
  bool bVar36;
  ushort uStackY_11e4;
  stat sStack_1110;
  char acStack_1080 [4104];
  ulong uStack_78;
  ulong uStack_70;
  ulong uStack_68;
  char *pcStack_60;
  ulong uStack_58;
  ulong uStack_50;
  undefined1 local_40 [4];
  undefined4 local_3c;
  int local_38;
  byte local_31;
  
  uVar20 = (ulong)(uint)interrupt_timeout;
  uVar17 = CONCAT62(in_register_00000012,tx_queues) & 0xffffffff;
  uVar34 = CONCAT62(in_register_00000032,rx_queues) & 0xffffffff;
  uStack_50 = 0x105386;
  uVar8 = pci_open_resource(pci_addr,"config",0);
  psVar30 = (stat *)local_40;
  uVar22 = 0;
  uStack_50 = 0x10539c;
  sVar11 = pread(uVar8,psVar30,2,0);
  if (sVar11 == 2) {
    local_3c = (undefined4)CONCAT62(in_register_00000032,rx_queues);
    unaff_R13 = (ulong)(ushort)local_40._0_2_;
    psVar30 = (stat *)(local_40 + 2);
    uVar22 = 2;
    uStack_50 = 0x1053cc;
    local_38 = interrupt_timeout;
    sVar11 = pread(uVar8,psVar30,2,2);
    if (sVar11 != 2) goto LAB_00105469;
    uVar34 = CONCAT62(in_register_00000012,tx_queues) & 0xffffffff;
    uVar20 = (ulong)(ushort)local_40._2_2_;
    psVar30 = (stat *)&stack0xffffffffffffffcc;
    uVar22 = 8;
    uStack_50 = 0x1053f5;
    sVar11 = pread(uVar8,psVar30,4,8);
    if (sVar11 != 4) goto LAB_0010546e;
    uVar17 = (ulong)local_31 << 0x18;
    uStack_50 = 0x10540b;
    close(uVar8);
    if ((int)uVar17 == 0x2000000) {
      if ((local_40._0_2_ == 0x1af4) && (0xfff < (ushort)local_40._2_2_)) {
        piVar12 = virtio_init(pci_addr,(uint16_t)local_3c,(uint16_t)uVar34);
        return piVar12;
      }
      piVar12 = ixgbe_init(pci_addr,(uint16_t)local_3c,(uint16_t)uVar34,local_38);
      return piVar12;
    }
  }
  else {
    uStack_50 = 0x105469;
    ixy_init_cold_1();
LAB_00105469:
    uStack_50 = 0x10546e;
    ixy_init_cold_2();
LAB_0010546e:
    uStack_50 = 0x105473;
    ixy_init_cold_3();
  }
  uStack_50 = 0x10547b;
  dev_00 = (ixgbe_device *)pci_addr;
  ixy_init_cold_4();
  __buf = psVar30;
  uVar29 = uVar22;
  uStack_78 = uVar20;
  uStack_70 = (ulong)uVar8;
  uStack_68 = unaff_R13;
  pcStack_60 = pci_addr;
  uStack_58 = uVar34;
  uStack_50 = uVar17;
  _Var9 = getuid();
  if (_Var9 != 0) {
    ixgbe_init_cold_1();
  }
  if ((ushort)psVar30 < 0x41) {
    if (extraout_DX < 0x41) {
      dev = (ixgbe_device *)malloc(0x88);
      pcVar13 = strdup((char *)dev_00);
      (dev->ixy).pci_addr = pcVar13;
      piVar23 = dev_00;
      snprintf(acStack_1080,0x1000,"/sys/bus/pci/devices/%s/iommu_group");
      uVar29 = (uint)piVar23;
      __buf = &sStack_1110;
      iVar10 = stat(acStack_1080,__buf);
      (dev->ixy).vfio = iVar10 == 0;
      if (iVar10 != 0) {
LAB_0010551c:
        (dev->ixy).driver_name = driver_name;
        (dev->ixy).num_rx_queues = (ushort)psVar30;
        (dev->ixy).num_tx_queues = extraout_DX;
        (dev->ixy).rx_batch = ixgbe_rx_batch;
        (dev->ixy).tx_batch = ixgbe_tx_batch;
        (dev->ixy).read_stats = ixgbe_read_stats;
        (dev->ixy).set_promisc = ixgbe_set_promisc;
        (dev->ixy).get_link_speed = ixgbe_get_link_speed;
        (dev->ixy).get_mac_addr = ixgbe_get_mac_addr;
        (dev->ixy).set_mac_addr = ixgbe_set_mac_addr;
        (dev->ixy).interrupts.interrupts_enabled = uVar22 != 0;
        (dev->ixy).interrupts.itr_rate = 0x28;
        (dev->ixy).interrupts.timeout_ms = uVar22;
        if ((uVar22 != 0) && ((dev->ixy).vfio == false)) {
          ixgbe_init_cold_2();
        }
        puVar1 = &(dev->ixy).num_rx_queues;
        if ((dev->ixy).vfio == true) {
          ixgbe_init_cold_3();
        }
        else {
          fprintf(_stderr,"[DEBUG] %s:%d %s(): mapping BAR0 region via pci file...\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                  ,0x238,"ixgbe_init");
          puVar14 = pci_map_resource((char *)dev_00);
          dev->addr = puVar14;
        }
        pvVar15 = calloc((ulong)psVar30 & 0xffff,0x8018);
        dev->rx_queues = pvVar15;
        pvVar15 = calloc((ulong)extraout_DX,0x8010);
        dev->tx_queues = pvVar15;
        fprintf(_stdout,"[INFO ] %s:%d %s(): Resetting device %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1bf,"reset_and_init",(dev->ixy).pci_addr);
        puVar14 = dev->addr;
        puVar14[0x880] = '\0';
        puVar14[0x881] = '\0';
        puVar14[0x882] = '\0';
        puVar14[0x883] = '\0';
        puVar14 = dev->addr;
        puVar14[0x888] = 0xff;
        puVar14[0x889] = 0xff;
        puVar14[0x88a] = 0xff;
        puVar14[0x88b] = 0xff;
        puVar14 = dev->addr;
        puVar14[0] = '\b';
        puVar14[1] = '\0';
        puVar14[2] = '\0';
        puVar14[3] = '\x04';
        if ((*(uint *)dev->addr & 0x4000008) != 0) {
          ixgbe_init_cold_4();
        }
        ppuVar2 = &dev->addr;
        usleep(10000);
        puVar14 = dev->addr;
        puVar14[0x880] = '\0';
        puVar14[0x881] = '\0';
        puVar14[0x882] = '\0';
        puVar14[0x883] = '\0';
        puVar14 = dev->addr;
        puVar14[0x888] = 0xff;
        puVar14[0x889] = 0xff;
        puVar14[0x88a] = 0xff;
        puVar14[0x88b] = 0xff;
        uVar8 = *(uint *)(dev->addr + 0x5400);
        uVar22 = *(uint *)(dev->addr + 0x5404);
        uVar20 = (ulong)(uVar8 >> 0x18);
        fprintf(_stdout,"[INFO ] %s:%d %s(): Initializing device %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1cd,"reset_and_init",(dev->ixy).pci_addr,uVar20);
        fprintf(_stdout,"[INFO ] %s:%d %s(): MAC address %02x:%02x:%02x:%02x:%02x:%02x\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1ce,"reset_and_init",(ulong)(uVar8 & 0xff),(ulong)(uVar8 >> 8 & 0xff),
                (ulong)(uVar8 >> 0x10 & 0xff),uVar20,(ulong)(uVar22 & 0xff),
                (ulong)(uVar22 >> 8 & 0xff));
        if ((*(uint *)(dev->addr + 0x10010) >> 9 & 1) == 0) {
          ixgbe_init_cold_5();
        }
        if ((*(uint *)(*ppuVar2 + 0x2f00) & 8) == 0) {
          ixgbe_init_cold_6();
        }
        puVar3 = &(dev->ixy).num_tx_queues;
        *(uint *)(*ppuVar2 + 0x42a0) = *(uint *)(*ppuVar2 + 0x42a0) & 0xffff1fff | 0x6000;
        *(uint *)(*ppuVar2 + 0x42a0) = *(uint *)(*ppuVar2 + 0x42a0) & 0xfffffe7f;
        *(uint *)(*ppuVar2 + 0x42a0) = *(uint *)(*ppuVar2 + 0x42a0) | 0x1000;
        *(uint *)(*ppuVar2 + 0x3000) = *(uint *)(*ppuVar2 + 0x3000) & 0xfffffffe;
        puVar14 = *ppuVar2;
        puVar14[0x3c00] = '\0';
        puVar14[0x3c01] = '\0';
        puVar14[0x3c02] = '\x02';
        puVar14[0x3c03] = '\0';
        lVar16 = 0;
        do {
          puVar14 = *ppuVar2 + lVar16 * 4 + 0x3c04;
          puVar14[0] = '\0';
          puVar14[1] = '\0';
          puVar14[2] = '\0';
          puVar14[3] = '\0';
          lVar16 = lVar16 + 1;
        } while (lVar16 != 7);
        *(uint *)(*ppuVar2 + 0x4240) = *(uint *)(*ppuVar2 + 0x4240) | 2;
        *(uint *)(*ppuVar2 + 0x2f00) = *(uint *)(*ppuVar2 + 0x2f00) | 2;
        *(uint *)(*ppuVar2 + 0x5080) = *(uint *)(*ppuVar2 + 0x5080) | 0x400;
        if (*puVar1 != 0) {
          ixgbe_init_cold_7();
        }
        *(uint *)(*ppuVar2 + 0x18) = *(uint *)(*ppuVar2 + 0x18) | 0x10000;
        if (*puVar1 != 0) {
          uVar8 = 0;
          uVar22 = 0x2200;
          do {
            uVar29 = uVar22;
            if (0xf < uVar8) {
              if (uVar8 < 0x40) {
                uVar29 = uVar8 * 0x40 | 0x100c;
              }
              else {
                uVar29 = uVar8 * 0x40 + 0xc00c;
              }
            }
            *(uint *)(*ppuVar2 + (int)uVar29) = *(uint *)(*ppuVar2 + (int)uVar29) & 0xffffefff;
            uVar8 = uVar8 + 1;
            uVar22 = uVar22 + 4;
          } while (uVar8 < *puVar1);
        }
        *(uint *)(*ppuVar2 + 0x3000) = *(uint *)(*ppuVar2 + 0x3000) | 1;
        *(uint *)(*ppuVar2 + 0x4240) = *(uint *)(*ppuVar2 + 0x4240) | 0x401;
        puVar14 = *ppuVar2;
        puVar14[0xcc00] = '\0';
        puVar14[0xcc01] = 0xa0;
        puVar14[0xcc02] = '\0';
        puVar14[0xcc03] = '\0';
        lVar16 = 0;
        do {
          puVar14 = *ppuVar2 + lVar16 * 4 + 0xcc04;
          puVar14[0] = '\0';
          puVar14[1] = '\0';
          puVar14[2] = '\0';
          puVar14[3] = '\0';
          lVar16 = lVar16 + 1;
        } while (lVar16 != 7);
        puVar14 = *ppuVar2;
        puVar14[0x8100] = 0xff;
        puVar14[0x8101] = 0xff;
        puVar14[0x8102] = '\0';
        puVar14[0x8103] = '\0';
        *(uint *)(*ppuVar2 + 0x4900) = *(uint *)(*ppuVar2 + 0x4900) & 0xffffffbf;
        if (*puVar3 != 0) {
          ixgbe_init_cold_8();
        }
        puVar14 = *ppuVar2;
        puVar14[0x4a80] = '\x01';
        puVar14[0x4a81] = '\0';
        puVar14[0x4a82] = '\0';
        puVar14[0x4a83] = '\0';
        if (*puVar1 != 0) {
          ixgbe_init_cold_9();
        }
        if (*puVar3 != 0) {
          ixgbe_init_cold_10();
        }
        if (*puVar1 != 0) {
          queue_id = 0;
          do {
            enable_interrupt(dev,queue_id);
            queue_id = queue_id + 1;
          } while (queue_id < (dev->ixy).num_rx_queues);
        }
        uVar8 = 0;
        fprintf(_stdout,"[INFO ] %s:%d %s(): enabling promisc mode\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x271,"ixgbe_set_promisc");
        *(uint *)(*ppuVar2 + 0x5080) = *(uint *)(*ppuVar2 + 0x5080) | 0x300;
        fprintf(_stdout,"[INFO ] %s:%d %s(): Waiting for link...\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1b3,"wait_for_link");
        if (((byte)(*(uint *)(*ppuVar2 + 0x42a4) >> 0x1e) &
            (*(uint *)(*ppuVar2 + 0x42a4) & 0x30000000) != 0) == 0) {
          iVar10 = -9900000;
          do {
            usleep(100000);
            if (((byte)(*(uint *)(*ppuVar2 + 0x42a4) >> 0x1e) &
                (*(uint *)(*ppuVar2 + 0x42a4) & 0x30000000) != 0) != 0) break;
            bVar36 = iVar10 != 0;
            iVar10 = iVar10 + 100000;
          } while (bVar36);
        }
        if ((*(uint *)(*ppuVar2 + 0x42a4) >> 0x1e & 1) != 0) {
          uVar8 = *(uint *)(&DAT_00108830 + (ulong)(*(uint *)(*ppuVar2 + 0x42a4) >> 0x1c & 3) * 4);
        }
        fprintf(_stdout,"[INFO ] %s:%d %s(): Link speed is %d Mbit/s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1ba,"wait_for_link",(ulong)uVar8);
        return &dev->ixy;
      }
      iVar10 = vfio_init((char *)dev_00);
      (dev->ixy).vfio_fd = iVar10;
      if (-1 < iVar10) goto LAB_0010551c;
      goto LAB_00105b68;
    }
  }
  else {
    ixgbe_init_cold_13();
  }
  ixgbe_init_cold_12();
LAB_00105b68:
  ixgbe_init_cold_11();
  _Var5 = (dev_00->ixy).interrupts.interrupts_enabled;
  uVar20 = (ulong)__buf & 0xffff;
  if (_Var5 == true) {
    interrupt = (dev_00->ixy).interrupts.queues + uVar20;
  }
  else {
    interrupt = (interrupt_queues *)0x0;
  }
  psVar30 = __buf;
  piVar23 = dev_00;
  if ((_Var5 != false) && (interrupt->interrupt_enabled == true)) {
    piVar23 = (ixgbe_device *)(ulong)(uint)interrupt->vfio_epoll_fd;
    psVar30 = (stat *)0xa;
    vfio_epoll_wait(interrupt->vfio_epoll_fd,10,(dev_00->ixy).interrupts.timeout_ms);
  }
  plVar4 = (long *)((long)dev_00->rx_queues + uVar20 * 0x18);
  uVar33 = *(ushort *)((long)plVar4 + 0x12);
  uVar17 = (ulong)uVar33;
  uVar8 = (uint)uVar33;
  if (uVar29 == 0) {
    uVar27 = 0;
LAB_00105cc9:
    if (uVar33 != (ushort)uVar8) {
      uVar24 = (int)uVar20 * 0x40;
      uVar22 = uVar24 + 0xc018;
      if ((ushort)__buf < 0x40) {
        uVar22 = uVar24 | 0x1018;
      }
      *(uint *)(dev_00->addr + uVar22) = uVar8 & 0xffff;
      *(ushort *)((long)plVar4 + 0x12) = uVar33;
    }
    if (_Var5 != false) {
      uVar20 = interrupt->instr_counter;
      auVar7 = vpmovsxbq_avx(ZEXT216(0x101));
      auVar6 = vpinsrq_avx(auVar7,uVar27 & 0xffffffff,1);
      auVar7._0_8_ = interrupt->instr_counter;
      auVar7._8_8_ = interrupt->rx_pkts;
      auVar7 = vpaddq_avx(auVar6,auVar7);
      interrupt->instr_counter = auVar7._0_8_;
      interrupt->rx_pkts = auVar7._8_8_;
      if ((uVar20 & 0xfff) == 0) {
        _Var5 = interrupt->interrupt_enabled;
        uVar19 = monotonic_time();
        uVar20 = uVar19 - interrupt->last_time_checked;
        if (interrupt->interval < uVar20) {
          check_interrupt(interrupt,uVar20,(uint32_t)uVar27,uVar29);
        }
        if (_Var5 != interrupt->interrupt_enabled) {
          if (interrupt->interrupt_enabled == false) {
            ixgbe_rx_batch_cold_3();
          }
          else {
            enable_interrupt(dev_00,(ushort)__buf);
          }
        }
      }
    }
    return (ixy_device *)(uVar27 & 0xffffffff);
  }
  uVar26 = 0;
  uVar34 = uVar17;
  while( true ) {
    iVar10 = (int)psVar30;
    uVar27 = uVar34 & 0xffff;
    uVar8 = (int)uVar27 << 4;
    uVar22 = *(uint *)(*plVar4 + 8 + (ulong)uVar8);
    uVar35 = uVar34;
    if ((uVar22 & 1) != 0) break;
LAB_00105ca9:
    uVar33 = (ushort)uVar35;
    uVar8 = (uint)uVar17;
    uVar27 = uVar26;
    if (((uVar22 & 1) == 0) ||
       (uVar26 = uVar26 + 1, uVar27 = (ulong)uVar29, uVar34 = uVar35, uVar29 == uVar26))
    goto LAB_00105cc9;
  }
  if ((uVar22 & 2) != 0) {
    plVar28 = (long *)(*plVar4 + (ulong)uVar8);
    uVar8 = (uint)*(ushort *)((long)plVar28 + 0xe);
    lVar16 = plVar4[uVar27 + 3];
    *(uint *)(lVar16 + 0x14) = (uint)*(ushort *)((long)plVar28 + 0xc);
    piVar23 = (ixgbe_device *)plVar4[1];
    ppVar18 = pkt_buf_alloc((mempool *)piVar23);
    iVar10 = (int)psVar30;
    if (ppVar18 != (pkt_buf *)0x0) {
      *plVar28 = ppVar18->buf_addr_phy + 0x40;
      plVar28[1] = 0;
      plVar4[uVar27 + 3] = (long)ppVar18;
      *(long *)(extraout_RDX + uVar26 * 8) = lVar16;
      uVar35 = (ulong)((int)plVar4[2] - 1U & (int)uVar34 + 1U);
      uVar17 = uVar34;
      goto LAB_00105ca9;
    }
    ixgbe_rx_batch_cold_1();
  }
  ixgbe_rx_batch_cold_2();
  plVar4 = (long *)((long)piVar23->tx_queues + (ulong)(uint)(iVar10 << 4));
  uVar22 = (uint)*(ushort *)((long)piVar23->tx_queues + (ulong)(uint)(iVar10 << 4) + 10);
  do {
    uVar29 = uVar22 & 0xffff;
    iVar25 = *(ushort *)((long)plVar4 + 0xc) - uVar29;
    if (iVar25 < 0) {
      iVar25 = iVar25 + (uint)*(ushort *)(plVar4 + 1);
    }
    bVar36 = false;
    if (0x1f < iVar25) {
      uVar24 = (uint)*(ushort *)(plVar4 + 1);
      if (uVar29 + 0x1f < (uint)*(ushort *)(plVar4 + 1)) {
        uVar24 = 0;
      }
      uVar24 = (uVar29 + 0x1f) - uVar24;
      if ((*(uint *)(*plVar4 + 0xc + (long)(int)uVar24 * 0x10) & 1) != 0) {
        for (; pkt_buf_free((pkt_buf *)plVar4[(ulong)uVar29 + 2]), uVar29 != uVar24;
            uVar29 = (int)plVar4[1] - 1U & uVar29 + 1 & 0xffff) {
        }
        uVar22 = (int)plVar4[1] - 1U & uVar24 + 1;
        bVar36 = true;
      }
    }
  } while (bVar36);
  *(ushort *)((long)plVar4 + 10) = (ushort)uVar22;
  piVar21 = (ixy_device *)0x0;
  piVar12 = piVar21;
  if (uVar8 != 0) {
    do {
      uVar33 = *(ushort *)((long)plVar4 + 0xc);
      uVar32 = (short)(int)plVar4[1] - 1U & uVar33 + 1;
      piVar12 = piVar21;
      if ((ushort)uVar22 == uVar32) break;
      plVar28 = *(long **)(extraout_RDX_00 + (long)piVar21 * 8);
      plVar4[(ulong)uVar33 + 2] = (long)plVar28;
      lVar16 = *plVar4;
      lVar31 = (ulong)uVar33 * 0x10;
      *(ushort *)((long)plVar4 + 0xc) = uVar32;
      *(long *)(lVar16 + lVar31) = *plVar28 + 0x40;
      *(uint *)(lVar16 + 8 + lVar31) = *(uint *)((long)plVar28 + 0x14) | 0x2b300000;
      *(int *)(lVar16 + 0xc + lVar31) = *(int *)((long)plVar28 + 0x14) << 0xe;
      piVar21 = (ixy_device *)((long)&piVar21->pci_addr + 1);
      piVar12 = (ixy_device *)(ulong)uVar8;
    } while ((ixy_device *)(ulong)uVar8 != piVar21);
  }
  uStackY_11e4 = (ushort)iVar10;
  *(uint *)(piVar23->addr + (ulong)uStackY_11e4 * 0x40 + 0x6018) =
       (uint)*(ushort *)((long)plVar4 + 0xc);
  return piVar12;
}

Assistant:

struct ixy_device* ixy_init(const char* pci_addr, uint16_t rx_queues, uint16_t tx_queues, int interrupt_timeout) {
	// Read PCI configuration space
	// For VFIO, we could access the config space another way
	// (VFIO_PCI_CONFIG_REGION_INDEX). This is not needed, though, because
	// every config file should be world-readable, and here we
	// only read the vendor and device id.
	int config = pci_open_resource(pci_addr, "config", O_RDONLY);
	uint16_t vendor_id = read_io16(config, 0);
	uint16_t device_id = read_io16(config, 2);
	uint32_t class_id = read_io32(config, 8) >> 24;
	close(config);
	if (class_id != 2) {
		error("Device %s is not a NIC", pci_addr);
	}
	if (vendor_id == 0x1af4 && device_id >= 0x1000) {
		return virtio_init(pci_addr, rx_queues, tx_queues);
	} else {
		// Our best guess is to try ixgbe
		return ixgbe_init(pci_addr, rx_queues, tx_queues, interrupt_timeout);
	}
}